

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrintValidatorTests.cpp
# Opt level: O3

int testVisionFeatureObjectPrintBasic(void)

{
  pointer pcVar1;
  bool bVar2;
  ImageFeatureType *this;
  FeatureType *this_00;
  ArrayFeatureType *pAVar3;
  FeatureType *this_01;
  FeatureType *this_02;
  ModelDescription *pMVar4;
  Type *pTVar5;
  Type *pTVar6;
  Type *pTVar7;
  ostream *poVar8;
  TypeUnion TVar9;
  VisionFeaturePrint_Objects *this_03;
  int iVar10;
  Model model;
  Result result;
  undefined1 local_b8 [32];
  TypeUnion local_98;
  uint32 local_8c [1];
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  ModelDescription *local_38;
  
  this = (ImageFeatureType *)operator_new(0x38);
  CoreML::Specification::ImageFeatureType::ImageFeatureType(this);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::clear_Type(this_00);
  this_00->_oneof_case_[0] = 4;
  (this_00->Type_).imagetype_ = this;
  pAVar3 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar3);
  this_01 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_01);
  CoreML::Specification::FeatureType::clear_Type(this_01);
  this_01->_oneof_case_[0] = 5;
  (this_01->Type_).multiarraytype_ = pAVar3;
  pAVar3 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar3);
  this_02 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_02);
  CoreML::Specification::FeatureType::clear_Type(this_02);
  this_02->_oneof_case_[0] = 5;
  (this_02->Type_).multiarraytype_ = pAVar3;
  pMVar4 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar4->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_38 = pMVar4;
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar4->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar4->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  if (pTVar5->type_ != (FeatureType *)0x0) {
    (*(pTVar5->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar5->type_ = this_00;
  if (pTVar6->type_ != (FeatureType *)0x0) {
    (*(pTVar6->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar6->type_ = this_01;
  if (pTVar7->type_ != (FeatureType *)0x0) {
    (*(pTVar7->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar7->type_ = this_02;
  pcVar1 = local_b8 + 0x10;
  local_b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"a","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b8);
  pMVar4 = local_38;
  if ((pointer)local_b8._0_8_ != pcVar1) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  local_b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"b","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b8);
  if ((pointer)local_b8._0_8_ != pcVar1) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  CoreML::Specification::Model::Model((Model *)local_b8);
  if ((long *)local_b8._16_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_b8._16_8_ + 8))();
  }
  local_b8._16_8_ = pMVar4;
  CoreML::validate<(MLModelType)2002>((Result *)local_60,(Model *)local_b8);
  bVar2 = CoreML::Result::good((Result *)local_60);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((result).good())",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    iVar10 = 1;
    std::ostream::flush();
  }
  else {
    if (local_8c[0] != 0x7d2) {
      CoreML::Specification::Model::clear_Type((Model *)local_b8);
      local_8c[0] = 0x7d2;
      TVar9.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x20);
      CoreML::Specification::CoreMLModels::VisionFeaturePrint::VisionFeaturePrint
                (TVar9.visionfeatureprint_);
      local_98.pipelineclassifier_ = TVar9.pipelineclassifier_;
    }
    TVar9 = local_98;
    CoreML::validate<(MLModelType)2002>((Result *)local_88,(Model *)local_b8);
    local_60 = local_88;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != &local_70) {
      operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
    }
    bVar2 = CoreML::Result::good((Result *)local_60);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((result).good())",0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      iVar10 = 1;
      std::ostream::flush();
    }
    else {
      if ((TVar9.treeensembleregressor_)->_cached_size_ == 0x15) {
        this_03 = ((VisionFeaturePrintTypeUnion *)&(TVar9.treeensembleregressor_)->treeensemble_)->
                  objects_;
      }
      else {
        CoreML::Specification::CoreMLModels::VisionFeaturePrint::clear_VisionFeaturePrintType
                  (TVar9.visionfeatureprint_);
        (TVar9.treeensembleregressor_)->_cached_size_ = 0x15;
        this_03 = (VisionFeaturePrint_Objects *)operator_new(0x30);
        CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::VisionFeaturePrint_Objects
                  (this_03);
        ((VisionFeaturePrintTypeUnion *)&(TVar9.treeensembleregressor_)->treeensemble_)->objects_ =
             this_03;
      }
      CoreML::validate<(MLModelType)2002>((Result *)local_88,(Model *)local_b8);
      local_60 = local_88;
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_p != &local_70) {
        operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
      }
      bVar2 = CoreML::Result::good((Result *)local_60);
      if (bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                   ,0x7c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((result).good())",0x12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      }
      else {
        this_03->version_ = 1;
        CoreML::validate<(MLModelType)2002>((Result *)local_88,(Model *)local_b8);
        local_60 = local_88;
        std::__cxx11::string::operator=((string *)&local_58,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_p != &local_70) {
          operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
        }
        bVar2 = CoreML::Result::good((Result *)local_60);
        if (bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                     ,0x7c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,99);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((result).good())",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        }
        else {
          CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::add_output(this_03,"a");
          CoreML::validate<(MLModelType)2002>((Result *)local_88,(Model *)local_b8);
          local_60 = local_88;
          std::__cxx11::string::operator=((string *)&local_58,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_p != &local_70) {
            operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
          }
          bVar2 = CoreML::Result::good((Result *)local_60);
          if (!bVar2) {
            CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::add_output(this_03,"b")
            ;
            CoreML::validate<(MLModelType)2002>((Result *)local_88,(Model *)local_b8);
            local_60 = local_88;
            std::__cxx11::string::operator=((string *)&local_58,(string *)&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_p != &local_70) {
              operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
            }
            bVar2 = CoreML::Result::good((Result *)local_60);
            iVar10 = 0;
            if (!bVar2) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                         ,0x7c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x6a);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(result).good()",0xf);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," was false, expected true.",0x1a);
              iVar10 = 1;
              std::endl<char,std::char_traits<char>>(poVar8);
            }
            goto LAB_00194687;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                     ,0x7c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x67);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((result).good())",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        }
      }
      std::ostream::put((char)poVar8);
      iVar10 = 1;
      std::ostream::flush();
    }
  }
LAB_00194687:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model((Model *)local_b8);
  return iVar10;
}

Assistant:

int testVisionFeatureObjectPrintBasic() {

    Specification::ImageFeatureType* inputImageFeatureType = new Specification::ImageFeatureType();
    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_imagetype(inputImageFeatureType);

    Specification::ArrayFeatureType* output1ArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* output1FeatureType = new Specification::FeatureType();
    output1FeatureType->set_allocated_multiarraytype(output1ArrayFeatureType);
    
    Specification::ArrayFeatureType* output2ArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* output2FeatureType = new Specification::FeatureType();
    output2FeatureType->set_allocated_multiarraytype(output2ArrayFeatureType);
    
    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output1 = description->add_output();
    Specification::FeatureDescription* output2 = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output1->set_allocated_type(output1FeatureType);
    output2->set_allocated_type(output2FeatureType);

    output1->set_name("a");
    output2->set_name("b");

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto *preprocessing = model.mutable_visionfeatureprint();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto objects = preprocessing->mutable_objects();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    objects->set_version(Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_1);
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    objects->add_output("a");
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);
    objects->add_output("b");
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_GOOD(result);

    return 0;
}